

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O1

uint32_t __thiscall pstore::header::get_crc(header *this)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = 0;
  uVar1 = 0;
  do {
    uVar1 = uVar1 >> 8 ^
            *(uint *)(details::crc32_tab +
                     (ulong)(byte)((this->a).signature1._M_elems[lVar2] ^ (byte)uVar1) * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  return ~uVar1;
}

Assistant:

std::uint32_t header::get_crc () const noexcept {
        return crc32 (::pstore::gsl::make_span (&this->a, 1));
    }